

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilk_fiber.cpp
# Opt level: O2

void cilk_fiber_tbb_interop_save_stack_op_info(__cilk_tbb_stack_op_thunk o)

{
  __cilk_tbb_stack_op_thunk *t;
  
  t = __cilkrts_get_tls_tbb_interop();
  if (t == (__cilk_tbb_stack_op_thunk *)0x0) {
    t = (__cilk_tbb_stack_op_thunk *)__cilkrts_malloc(0x10);
    __cilkrts_set_tls_tbb_interop(t);
  }
  t->routine = o.routine;
  t->data = o.data;
  return;
}

Assistant:

void cilk_fiber_tbb_interop_save_stack_op_info(__cilk_tbb_stack_op_thunk o)
{
    __cilk_tbb_stack_op_thunk *saved_thunk =
        __cilkrts_get_tls_tbb_interop();

    DBG_STACK_OPS("Calling save_stack_op; o.routine=%p, o.data=%p, saved_thunk=%p\n",
                  o.routine, o.data, saved_thunk);

    // If there is not already space allocated, allocate some.
    if (NULL == saved_thunk) {
        saved_thunk = (__cilk_tbb_stack_op_thunk*)
            __cilkrts_malloc(sizeof(__cilk_tbb_stack_op_thunk));
        __cilkrts_set_tls_tbb_interop(saved_thunk);
    }

    *saved_thunk = o;

    DBG_STACK_OPS ("Unbound Thread %04x: tbb_interop_save_stack_op_info - saved info\n",
                   cilkos_get_current_thread_id());
}